

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calculator.hpp
# Opt level: O1

Operator __thiscall
calculator::ExpressionParser<__int128>::parseOp(ExpressionParser<__int128> *this)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  int iVar8;
  Operator OVar9;
  string local_38;
  
  eatSpaces(this);
  uVar2 = (this->expr_)._M_string_length;
  uVar3 = this->index_;
  if (uVar3 < uVar2) {
    bVar4 = (this->expr_)._M_dataplus._M_p[uVar3];
  }
  else {
    bVar4 = 0;
  }
  iVar8 = 0x4c;
  uVar5 = 0;
  if (bVar4 < 0x3c) {
    switch(bVar4) {
    case 0x25:
      uVar6 = 0x1400000000;
      this->index_ = uVar3 + 1;
      uVar5 = 10;
      break;
    case 0x26:
      this->index_ = uVar3 + 1;
      uVar6 = 0x600000000;
      uVar5 = 3;
      break;
    default:
switchD_00119193_caseD_27:
      uVar6 = 0;
      break;
    case 0x2a:
      uVar6 = 0x1400000000;
      uVar1 = uVar3 + 1;
      this->index_ = uVar1;
      uVar5 = 8;
      if ((uVar2 <= uVar1) || ((this->expr_)._M_dataplus._M_p[uVar1] != '*')) break;
      sVar7 = uVar3 + 2;
LAB_0011932f:
      uVar6 = 0x1e00000000;
      this->index_ = sVar7;
      iVar8 = 0x52;
      uVar5 = 0xb;
      break;
    case 0x2b:
      uVar6 = 0xa00000000;
      this->index_ = uVar3 + 1;
      uVar5 = 6;
      break;
    case 0x2d:
      uVar6 = 0xa00000000;
      this->index_ = uVar3 + 1;
      uVar5 = 7;
      break;
    case 0x2f:
      uVar6 = 0x1400000000;
      this->index_ = uVar3 + 1;
      uVar5 = 9;
    }
  }
  else {
    if (bVar4 < 0x5e) {
      if (bVar4 == 0x3c) {
        local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"<<","");
        expect(this,&local_38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
        uVar6 = 0x900000000;
        uVar5 = 4;
        goto LAB_00119392;
      }
      if (bVar4 == 0x3e) {
        local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,">>","");
        expect(this,&local_38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
        uVar6 = 0x900000000;
        uVar5 = 5;
        goto LAB_00119392;
      }
      uVar6 = 0;
      if (bVar4 != 0x45) goto LAB_00119392;
    }
    else {
      if (bVar4 == 0x5e) {
        sVar7 = uVar3 + 1;
        goto LAB_0011932f;
      }
      if (bVar4 != 0x65) {
        if (bVar4 == 0x7c) {
          this->index_ = uVar3 + 1;
          uVar6 = 0x400000000;
          uVar5 = 1;
          goto LAB_00119392;
        }
        goto switchD_00119193_caseD_27;
      }
    }
    uVar6 = 0x2800000000;
    this->index_ = uVar3 + 1;
    iVar8 = 0x52;
    uVar5 = 0xc;
  }
LAB_00119392:
  OVar9._0_8_ = uVar5 | uVar6;
  OVar9.associativity = iVar8;
  return OVar9;
}

Assistant:

Operator parseOp()
  {
    eatSpaces();
    switch (getCharacter())
    {
      case '|': index_++;     return Operator(OPERATOR_BITWISE_OR,      4, 'L');
      case '&': index_++;     return Operator(OPERATOR_BITWISE_AND,     6, 'L');
      case '<': expect("<<"); return Operator(OPERATOR_BITWISE_SHL,     9, 'L');
      case '>': expect(">>"); return Operator(OPERATOR_BITWISE_SHR,     9, 'L');
      case '+': index_++;     return Operator(OPERATOR_ADDITION,       10, 'L');
      case '-': index_++;     return Operator(OPERATOR_SUBTRACTION,    10, 'L');
      case '/': index_++;     return Operator(OPERATOR_DIVISION,       20, 'L');
      case '%': index_++;     return Operator(OPERATOR_MODULO,         20, 'L');
      case '*': index_++; if (getCharacter() != '*')
                              return Operator(OPERATOR_MULTIPLICATION, 20, 'L');
                index_++;     return Operator(OPERATOR_POWER,          30, 'R');
      case '^': index_++;     return Operator(OPERATOR_POWER,          30, 'R');
      case 'e': index_++;     return Operator(OPERATOR_EXPONENT,       40, 'R');
      case 'E': index_++;     return Operator(OPERATOR_EXPONENT,       40, 'R');
      default :               return Operator(OPERATOR_NULL,            0, 'L');
    }
  }